

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::Segment::WriteSegmentHeader(Segment *this)

{
  bool bVar1;
  int iVar2;
  int32 iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint64_t uVar4;
  ulong uVar5;
  char *doc_type;
  ulong uVar6;
  
  UpdateDocTypeVersion(this);
  bVar1 = DocTypeIsWebm(this);
  doc_type = "matroska";
  if (bVar1) {
    doc_type = "webm";
  }
  bVar1 = WriteEbmlHeader(this->writer_header_,(ulong)this->doc_type_version_,doc_type);
  if (bVar1) {
    this->doc_type_version_written_ = this->doc_type_version_;
    iVar2 = (*this->writer_header_->_vptr_IMkvWriter[1])();
    this->ebml_header_size_ = iVar2;
    iVar3 = WriteID(this->writer_header_,0x18538067);
    if (iVar3 == 0) {
      iVar2 = (*this->writer_header_->_vptr_IMkvWriter[1])();
      this->size_position_ = CONCAT44(extraout_var,iVar2);
      iVar3 = SerializeInt(this->writer_header_,0x1ffffffffffffff,8);
      if (iVar3 == 0) {
        iVar2 = (*this->writer_header_->_vptr_IMkvWriter[1])();
        this->payload_pos_ = CONCAT44(extraout_var_00,iVar2);
        if ((this->mode_ == kFile) &&
           (iVar2 = (*this->writer_header_->_vptr_IMkvWriter[3])(), (char)iVar2 != '\0')) {
          (this->segment_info_).duration_ = 1.0;
          bVar1 = SeekHead::Write(&this->seek_head_,this->writer_header_);
          if (!bVar1) {
            return false;
          }
        }
        uVar4 = MaxOffset(this);
        if ((this->seek_head_).seek_entry_id_[0] == 0) {
          bVar1 = true;
          uVar5 = 0;
        }
        else {
          uVar5 = 0;
          do {
            uVar6 = uVar5;
            bVar1 = uVar6 < 4;
            if (uVar6 == 4) goto LAB_0011f10b;
            uVar5 = uVar6 + 1;
          } while ((this->seek_head_).seek_entry_id_[uVar6 + 1] != 0);
          bVar1 = uVar6 < 4;
        }
        (this->seek_head_).seek_entry_id_[uVar5] = 0x1549a966;
        (this->seek_head_).seek_entry_pos_[uVar5] = uVar4;
LAB_0011f10b:
        if ((bVar1) &&
           (bVar1 = SegmentInfo::Write(&this->segment_info_,this->writer_header_), bVar1)) {
          uVar4 = MaxOffset(this);
          if ((this->seek_head_).seek_entry_id_[0] == 0) {
            bVar1 = true;
            uVar5 = 0;
          }
          else {
            uVar5 = 0;
            do {
              uVar6 = uVar5;
              bVar1 = uVar6 < 4;
              if (uVar6 == 4) goto LAB_0011f172;
              uVar5 = uVar6 + 1;
            } while ((this->seek_head_).seek_entry_id_[uVar6 + 1] != 0);
            bVar1 = uVar6 < 4;
          }
          (this->seek_head_).seek_entry_id_[uVar5] = 0x1654ae6b;
          (this->seek_head_).seek_entry_pos_[uVar5] = uVar4;
LAB_0011f172:
          if ((bVar1) && (bVar1 = Tracks::Write(&this->tracks_,this->writer_header_), bVar1)) {
            if (0 < (this->chapters_).chapters_count_) {
              uVar4 = MaxOffset(this);
              if ((this->seek_head_).seek_entry_id_[0] == 0) {
                bVar1 = true;
                uVar5 = 0;
              }
              else {
                uVar5 = 0;
                do {
                  uVar6 = uVar5;
                  bVar1 = uVar6 < 4;
                  if (uVar6 == 4) goto LAB_0011f1e5;
                  uVar5 = uVar6 + 1;
                } while ((this->seek_head_).seek_entry_id_[uVar6 + 1] != 0);
                bVar1 = uVar6 < 4;
              }
              (this->seek_head_).seek_entry_id_[uVar5] = 0x1043a770;
              (this->seek_head_).seek_entry_pos_[uVar5] = uVar4;
LAB_0011f1e5:
              if (!bVar1) {
                return false;
              }
              bVar1 = Chapters::Write(&this->chapters_,this->writer_header_);
              if (!bVar1) {
                return false;
              }
            }
            if (0 < (this->tags_).tags_count_) {
              uVar4 = MaxOffset(this);
              if ((this->seek_head_).seek_entry_id_[0] == 0) {
                bVar1 = true;
                uVar5 = 0;
              }
              else {
                uVar5 = 0;
                do {
                  uVar6 = uVar5;
                  bVar1 = uVar6 < 4;
                  if (uVar6 == 4) goto LAB_0011f258;
                  uVar5 = uVar6 + 1;
                } while ((this->seek_head_).seek_entry_id_[uVar6 + 1] != 0);
                bVar1 = uVar6 < 4;
              }
              (this->seek_head_).seek_entry_id_[uVar5] = 0x1254c367;
              (this->seek_head_).seek_entry_pos_[uVar5] = uVar4;
LAB_0011f258:
              if (!bVar1) {
                return false;
              }
              bVar1 = Tags::Write(&this->tags_,this->writer_header_);
              if (!bVar1) {
                return false;
              }
            }
            if ((this->chunking_ == true) &&
               ((this->mode_ == kLive ||
                (iVar2 = (*this->writer_header_->_vptr_IMkvWriter[3])(), (char)iVar2 == '\0')))) {
              if (this->chunk_writer_header_ == (MkvWriter *)0x0) {
                return false;
              }
              MkvWriter::Close(this->chunk_writer_header_);
            }
            this->header_written_ = true;
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Segment::WriteSegmentHeader() {
  UpdateDocTypeVersion();

  const char* const doc_type =
      DocTypeIsWebm() ? kDocTypeWebm : kDocTypeMatroska;
  if (!WriteEbmlHeader(writer_header_, doc_type_version_, doc_type))
    return false;
  doc_type_version_written_ = doc_type_version_;
  ebml_header_size_ = static_cast<int32_t>(writer_header_->Position());

  // Write "unknown" (-1) as segment size value. If mode is kFile, Segment
  // will write over duration when the file is finalized.
  if (WriteID(writer_header_, libwebm::kMkvSegment))
    return false;

  // Save for later.
  size_position_ = writer_header_->Position();

  // Write "unknown" (EBML coded -1) as segment size value. We need to write 8
  // bytes because if we are going to overwrite the segment size later we do
  // not know how big our segment will be.
  if (SerializeInt(writer_header_, kEbmlUnknownValue, 8))
    return false;

  payload_pos_ = writer_header_->Position();

  if (mode_ == kFile && writer_header_->Seekable()) {
    // Set the duration > 0.0 so SegmentInfo will write out the duration. When
    // the muxer is done writing we will set the correct duration and have
    // SegmentInfo upadte it.
    segment_info_.set_duration(1.0);

    if (!seek_head_.Write(writer_header_))
      return false;
  }

  if (!seek_head_.AddSeekEntry(libwebm::kMkvInfo, MaxOffset()))
    return false;
  if (!segment_info_.Write(writer_header_))
    return false;

  if (!seek_head_.AddSeekEntry(libwebm::kMkvTracks, MaxOffset()))
    return false;
  if (!tracks_.Write(writer_header_))
    return false;

  if (chapters_.Count() > 0) {
    if (!seek_head_.AddSeekEntry(libwebm::kMkvChapters, MaxOffset()))
      return false;
    if (!chapters_.Write(writer_header_))
      return false;
  }

  if (tags_.Count() > 0) {
    if (!seek_head_.AddSeekEntry(libwebm::kMkvTags, MaxOffset()))
      return false;
    if (!tags_.Write(writer_header_))
      return false;
  }

  if (chunking_ && (mode_ == kLive || !writer_header_->Seekable())) {
    if (!chunk_writer_header_)
      return false;

    chunk_writer_header_->Close();
  }

  header_written_ = true;

  return true;
}